

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

idx_t __thiscall duckdb::HashJoinGlobalSourceState::MaxThreads(HashJoinGlobalSourceState *this)

{
  bool bVar1;
  pointer pGVar2;
  pointer pJVar3;
  pointer this_00;
  idx_t *piVar4;
  
  pGVar2 = unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true>::
           operator->(&(this->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                       super_CachingPhysicalOperator.super_PhysicalOperator.sink_state);
  if (pGVar2[2].super_StateWithBlockableTasks.blocked_tasks.
      super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
      super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)0x0) {
    bVar1 = PropagatesBuildSide((this->op->super_PhysicalComparisonJoin).super_PhysicalJoin.
                                super_CachingPhysicalOperator.field_0x81);
    if (!bVar1) {
      return 0;
    }
    pJVar3 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
             operator->((unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>
                         *)((long)&pGVar2[1].super_StateWithBlockableTasks.lock.super___mutex_base.
                                   _M_mutex + 0x10));
    this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->(&pJVar3->data_collection);
    piVar4 = TupleDataCollection::Count(this_00);
  }
  else {
    piVar4 = &this->probe_count;
  }
  return *piVar4 / (this->parallel_scan_chunk_count << 0xb);
}

Assistant:

idx_t MaxThreads() override {
		D_ASSERT(op.sink_state);
		auto &gstate = op.sink_state->Cast<HashJoinGlobalSinkState>();

		idx_t count;
		if (gstate.probe_spill) {
			count = probe_count;
		} else if (PropagatesBuildSide(op.join_type)) {
			count = gstate.hash_table->Count();
		} else {
			return 0;
		}
		return count / ((idx_t)STANDARD_VECTOR_SIZE * parallel_scan_chunk_count);
	}